

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O1

void __thiscall
tonk::
LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>::
rehash(LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
       *this,uint new_hash_size)

{
  uint uVar1;
  uint uVar2;
  raw_node *prVar3;
  raw_node *prVar4;
  ulong uVar5;
  ulong *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong *puVar10;
  uint64_t uVar11;
  raw_node *prVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  raw_node *addr;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  
  uVar1 = this->m_num_valid;
  if ((uVar1 <= new_hash_size) && (uVar2 = this->m_values_count, uVar2 != new_hash_size)) {
    prVar3 = this->m_values;
    uVar14 = (ulong)new_hash_size;
    puVar10 = (ulong *)operator_new__(uVar14 * 0x30 + 8);
    *puVar10 = uVar14;
    if (new_hash_size != 0) {
      auVar19 = vpbroadcastq_avx512f();
      auVar19 = vpsrlq_avx512f(auVar19,5);
      uVar16 = 0;
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar26 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      puVar6 = puVar10;
      do {
        auVar28 = vpbroadcastq_avx512f();
        auVar29 = vporq_avx512f(auVar28,auVar27);
        uVar5 = vpcmpuq_avx512f(auVar29,auVar19,2);
        if ((uVar5 & 1) != 0) {
          *(undefined1 *)(puVar6 + 6) = 0;
        }
        if ((uVar5 & 2) != 0) {
          *(undefined1 *)(puVar6 + 0xc) = 0;
        }
        if ((uVar5 & 4) != 0) {
          *(undefined1 *)(puVar6 + 0x12) = 0;
        }
        if ((uVar5 & 8) != 0) {
          *(undefined1 *)(puVar6 + 0x18) = 0;
        }
        if ((uVar5 & 0x10) != 0) {
          *(undefined1 *)(puVar6 + 0x1e) = 0;
        }
        if ((uVar5 & 0x20) != 0) {
          *(undefined1 *)(puVar6 + 0x24) = 0;
        }
        if ((uVar5 & 0x40) != 0) {
          *(undefined1 *)(puVar6 + 0x2a) = 0;
        }
        if ((uVar5 & 0x80) != 0) {
          *(undefined1 *)(puVar6 + 0x30) = 0;
        }
        auVar29 = vporq_avx512f(auVar28,auVar26);
        uVar5 = vpcmpuq_avx512f(auVar29,auVar19,2);
        if ((uVar5 & 1) != 0) {
          *(undefined1 *)(puVar6 + 0x36) = 0;
        }
        if ((uVar5 & 2) != 0) {
          *(undefined1 *)(puVar6 + 0x3c) = 0;
        }
        if ((uVar5 & 4) != 0) {
          *(undefined1 *)(puVar6 + 0x42) = 0;
        }
        if ((uVar5 & 8) != 0) {
          *(undefined1 *)(puVar6 + 0x48) = 0;
        }
        if ((uVar5 & 0x10) != 0) {
          *(undefined1 *)(puVar6 + 0x4e) = 0;
        }
        if ((uVar5 & 0x20) != 0) {
          *(undefined1 *)(puVar6 + 0x54) = 0;
        }
        if ((uVar5 & 0x40) != 0) {
          *(undefined1 *)(puVar6 + 0x5a) = 0;
        }
        if ((uVar5 & 0x80) != 0) {
          *(undefined1 *)(puVar6 + 0x60) = 0;
        }
        auVar29 = vporq_avx512f(auVar28,auVar25);
        uVar5 = vpcmpuq_avx512f(auVar29,auVar19,2);
        if ((uVar5 & 1) != 0) {
          *(undefined1 *)(puVar6 + 0x66) = 0;
        }
        if ((uVar5 & 2) != 0) {
          *(undefined1 *)(puVar6 + 0x6c) = 0;
        }
        if ((uVar5 & 4) != 0) {
          *(undefined1 *)(puVar6 + 0x72) = 0;
        }
        if ((uVar5 & 8) != 0) {
          *(undefined1 *)(puVar6 + 0x78) = 0;
        }
        if ((uVar5 & 0x10) != 0) {
          *(undefined1 *)(puVar6 + 0x7e) = 0;
        }
        if ((uVar5 & 0x20) != 0) {
          *(undefined1 *)(puVar6 + 0x84) = 0;
        }
        if ((uVar5 & 0x40) != 0) {
          *(undefined1 *)(puVar6 + 0x8a) = 0;
        }
        if ((uVar5 & 0x80) != 0) {
          *(undefined1 *)(puVar6 + 0x90) = 0;
        }
        auVar29 = vporq_avx512f(auVar28,auVar24);
        uVar5 = vpcmpuq_avx512f(auVar29,auVar19,2);
        if ((uVar5 & 1) != 0) {
          *(undefined1 *)(puVar6 + 0x96) = 0;
        }
        if ((uVar5 & 2) != 0) {
          *(undefined1 *)(puVar6 + 0x9c) = 0;
        }
        if ((uVar5 & 4) != 0) {
          *(undefined1 *)(puVar6 + 0xa2) = 0;
        }
        if ((uVar5 & 8) != 0) {
          *(undefined1 *)(puVar6 + 0xa8) = 0;
        }
        if ((uVar5 & 0x10) != 0) {
          *(undefined1 *)(puVar6 + 0xae) = 0;
        }
        if ((uVar5 & 0x20) != 0) {
          *(undefined1 *)(puVar6 + 0xb4) = 0;
        }
        if ((uVar5 & 0x40) != 0) {
          *(undefined1 *)(puVar6 + 0xba) = 0;
        }
        if ((uVar5 & 0x80) != 0) {
          *(undefined1 *)(puVar6 + 0xc0) = 0;
        }
        auVar29 = vporq_avx512f(auVar28,auVar23);
        uVar5 = vpcmpuq_avx512f(auVar29,auVar19,2);
        if ((uVar5 & 1) != 0) {
          *(undefined1 *)(puVar6 + 0xc6) = 0;
        }
        if ((uVar5 & 2) != 0) {
          *(undefined1 *)(puVar6 + 0xcc) = 0;
        }
        if ((uVar5 & 4) != 0) {
          *(undefined1 *)(puVar6 + 0xd2) = 0;
        }
        if ((uVar5 & 8) != 0) {
          *(undefined1 *)(puVar6 + 0xd8) = 0;
        }
        if ((uVar5 & 0x10) != 0) {
          *(undefined1 *)(puVar6 + 0xde) = 0;
        }
        if ((uVar5 & 0x20) != 0) {
          *(undefined1 *)(puVar6 + 0xe4) = 0;
        }
        if ((uVar5 & 0x40) != 0) {
          *(undefined1 *)(puVar6 + 0xea) = 0;
        }
        if ((uVar5 & 0x80) != 0) {
          *(undefined1 *)(puVar6 + 0xf0) = 0;
        }
        auVar29 = vporq_avx512f(auVar28,auVar22);
        uVar5 = vpcmpuq_avx512f(auVar29,auVar19,2);
        if ((uVar5 & 1) != 0) {
          *(undefined1 *)(puVar6 + 0xf6) = 0;
        }
        if ((uVar5 & 2) != 0) {
          *(undefined1 *)(puVar6 + 0xfc) = 0;
        }
        if ((uVar5 & 4) != 0) {
          *(undefined1 *)(puVar6 + 0x102) = 0;
        }
        if ((uVar5 & 8) != 0) {
          *(undefined1 *)(puVar6 + 0x108) = 0;
        }
        if ((uVar5 & 0x10) != 0) {
          *(undefined1 *)(puVar6 + 0x10e) = 0;
        }
        if ((uVar5 & 0x20) != 0) {
          *(undefined1 *)(puVar6 + 0x114) = 0;
        }
        if ((uVar5 & 0x40) != 0) {
          *(undefined1 *)(puVar6 + 0x11a) = 0;
        }
        if ((uVar5 & 0x80) != 0) {
          *(undefined1 *)(puVar6 + 0x120) = 0;
        }
        auVar29 = vporq_avx512f(auVar28,auVar21);
        uVar5 = vpcmpuq_avx512f(auVar29,auVar19,2);
        if ((uVar5 & 1) != 0) {
          *(undefined1 *)(puVar6 + 0x126) = 0;
        }
        if ((uVar5 & 2) != 0) {
          *(undefined1 *)(puVar6 + 300) = 0;
        }
        if ((uVar5 & 4) != 0) {
          *(undefined1 *)(puVar6 + 0x132) = 0;
        }
        if ((uVar5 & 8) != 0) {
          *(undefined1 *)(puVar6 + 0x138) = 0;
        }
        if ((uVar5 & 0x10) != 0) {
          *(undefined1 *)(puVar6 + 0x13e) = 0;
        }
        if ((uVar5 & 0x20) != 0) {
          *(undefined1 *)(puVar6 + 0x144) = 0;
        }
        if ((uVar5 & 0x40) != 0) {
          *(undefined1 *)(puVar6 + 0x14a) = 0;
        }
        if ((uVar5 & 0x80) != 0) {
          *(undefined1 *)(puVar6 + 0x150) = 0;
        }
        auVar28 = vporq_avx512f(auVar28,auVar20);
        uVar5 = vpcmpuq_avx512f(auVar28,auVar19,2);
        if ((uVar5 & 1) != 0) {
          *(undefined1 *)(puVar6 + 0x156) = 0;
        }
        if ((uVar5 & 2) != 0) {
          *(undefined1 *)(puVar6 + 0x15c) = 0;
        }
        if ((uVar5 & 4) != 0) {
          *(undefined1 *)(puVar6 + 0x162) = 0;
        }
        if ((uVar5 & 8) != 0) {
          *(undefined1 *)(puVar6 + 0x168) = 0;
        }
        if ((uVar5 & 0x10) != 0) {
          *(undefined1 *)(puVar6 + 0x16e) = 0;
        }
        if ((uVar5 & 0x20) != 0) {
          *(undefined1 *)(puVar6 + 0x174) = 0;
        }
        if ((uVar5 & 0x40) != 0) {
          *(undefined1 *)(puVar6 + 0x17a) = 0;
        }
        if ((uVar5 & 0x80) != 0) {
          *(undefined1 *)(puVar6 + 0x180) = 0;
        }
        uVar16 = uVar16 + 0x40;
        puVar6 = puVar6 + 0x180;
      } while (((uVar14 * 0x30 - 0x30) / 0x30 + 0x40 & 0xffffffffffffffc0) != uVar16);
    }
    this->m_values = (raw_node *)(puVar10 + 1);
    this->m_values_count = new_hash_size;
    this->m_num_valid = 0;
    this->m_hash_shift = (LZCOUNT(new_hash_size) ^ 0xffffffe0U) + 0x21;
    if (uVar2 != 0) {
      uVar14 = 0;
      do {
        if (prVar3[uVar14].m_bits[0x28] != '\0') {
          addr = prVar3 + uVar14;
          uVar11 = HashUDPAddress((UDPAddress *)addr);
          uVar13 = (uint)((int)uVar11 * -0x61c88647) >> ((byte)this->m_hash_shift & 0x1f);
          prVar4 = this->m_values;
          prVar12 = prVar4 + uVar13;
          if (prVar4[uVar13].m_bits[0x28] != '\0') {
            uVar15 = this->m_values_count - 1;
            uVar18 = uVar13;
            do {
              uVar17 = uVar18 - 1;
              if (uVar18 == 0) {
                uVar17 = uVar15;
              }
              if (uVar17 == uVar13) goto LAB_0014ae56;
              prVar12 = prVar12 + -1;
              if (uVar18 == 0) {
                prVar12 = prVar4 + uVar15;
              }
              uVar18 = uVar17;
            } while (prVar12->m_bits[0x28] != '\0');
          }
          uVar7 = *(undefined8 *)addr->m_bits;
          uVar8 = *(undefined8 *)(addr->m_bits + 8);
          uVar9 = *(undefined8 *)(addr->m_bits + 0x14);
          *(undefined8 *)(prVar12->m_bits + 0xc) = *(undefined8 *)(addr->m_bits + 0xc);
          *(undefined8 *)(prVar12->m_bits + 0x14) = uVar9;
          *(undefined8 *)prVar12->m_bits = uVar7;
          *(undefined8 *)(prVar12->m_bits + 8) = uVar8;
          *(undefined8 *)(prVar12->m_bits + 0x20) = *(undefined8 *)(addr->m_bits + 0x20);
          prVar12->m_bits[0x28] = addr->m_bits[0x28];
          addr->m_bits[0x28] = '\0';
          this->m_num_valid = this->m_num_valid + 1;
LAB_0014ae56:
          if (uVar1 == this->m_num_valid) break;
        }
        uVar13 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar13;
      } while (uVar13 < uVar2);
    }
    this->m_grow_threshold = new_hash_size + 1 >> 1;
    if (prVar3 != (raw_node *)0x0) {
      operator_delete__(prVar3[-1].m_bits + 0x28);
      return;
    }
  }
  return;
}

Assistant:

inline void rehash(unsigned new_hash_size)
    {
        TONK_DEBUG_ASSERT(new_hash_size >= m_num_valid);
        TONK_DEBUG_ASSERT((new_hash_size & (new_hash_size - 1)) == 0); // ispow2

        if ((new_hash_size < m_num_valid) ||
            (new_hash_size == m_values_count))
        {
            return;
        }

        raw_node* old_values = m_values;
        const unsigned old_values_count = m_values_count;
        const unsigned old_num_valid = m_num_valid;

        m_values = new raw_node[new_hash_size];
        m_values_count = new_hash_size;

        m_num_valid = 0;
        const unsigned bitIndex = NonzeroLowestBitIndex(new_hash_size);
        m_hash_shift = 32 - bitIndex;
        TONK_DEBUG_ASSERT(new_hash_size == (1U << (32 - m_hash_shift)));

        for (unsigned i = 0; i < old_values_count; ++i)
        {
            node* pNode = reinterpret_cast<node*>( old_values + i );

            if (pNode->state)
            {
                move_into(pNode);

                if (old_num_valid == m_num_valid) {
                    break;
                }
            }
        }

        m_grow_threshold = (new_hash_size + 1) >> 1;

        delete[] old_values;
    }